

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3s.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mrg3s *R)

{
  delim_c dVar1;
  bool bVar2;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var3;
  basic_istream<char,_std::char_traits<char>_> *this;
  delim_str P;
  int *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  delim_str *in_stack_ffffffffffffffa8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  mrg_status<int,_3,_trng::mrg3s> local_28;
  mrg_parameter<int,_3,_trng::mrg3s> local_1c;
  int *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_parameter<int,_3,_trng::mrg3s>::mrg_parameter(&local_1c);
  mrg_status<int,_3,_trng::mrg3s>::mrg_status(&local_28);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var3 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var3 = Catch::clara::std::operator|(_Var3,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var3);
  in_00 = local_8;
  utility::ignore_spaces();
  utility::operator>>(in_00,(ignore_spaces_cl *)this);
  dVar1 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  mrg3s::name();
  P = utility::delim((char *)this);
  utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(__fmtfl,CONCAT22(in_stack_ffffffffffffffd2,
                                       CONCAT11(dVar1.c,in_stack_ffffffffffffffd0))),
             (mrg_parameter<int,_3,_trng::mrg3s> *)P.str);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(__fmtfl,CONCAT22(in_stack_ffffffffffffffd2,
                                       CONCAT11(dVar1.c,in_stack_ffffffffffffffd0))),
             (mrg_status<int,_3,_trng::mrg3s> *)P.str);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar2 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar2) {
    *(undefined8 *)local_10 = local_1c.a._0_8_;
    local_10[2] = local_1c.a[2];
    *(undefined8 *)(local_10 + 3) = local_28.r._0_8_;
    local_10[5] = local_28.r[2];
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg3s &R) {
      mrg3s::parameter_type P_new;
      mrg3s::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg3s::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }